

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O2

void __thiscall
unitStringDefinitions_customaryVector_Test::~unitStringDefinitions_customaryVector_Test
          (unitStringDefinitions_customaryVector_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStringDefinitions, customaryVector)
{
    for (std::size_t ii = 0; ii < units::defined_unit_strings_customary.size();
         ++ii) {
        EXPECT_TRUE(units::defined_unit_strings_customary[ii].first != nullptr)
            << ii;
        if (units::defined_unit_strings_customary[ii].first == nullptr) {
            break;
        }
    }
}